

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O0

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  UInt UVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pbVar5;
  size_t in_RCX;
  void *in_RDX;
  string *in_RSI;
  const_iterator cVar6;
  uint fill;
  Value *element_1;
  ValueConstIterator iter_2;
  runtime_error *e;
  const_iterator iter_1;
  Value *element;
  ValueConstIterator iter;
  signalReferences_t signalReferences;
  Value *in_stack_00000438;
  StreamClient *in_stack_fffffffffffffd98;
  FastWriter *in_stack_fffffffffffffda0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdb0;
  string local_1a8 [16];
  signalReferences_t *in_stack_fffffffffffffe68;
  StreamClient *in_stack_fffffffffffffe70;
  string local_180 [32];
  reference local_160;
  _Base_ptr local_158;
  undefined1 local_150;
  _Base_ptr local_148;
  undefined1 local_140;
  _Base_ptr local_138;
  undefined1 local_130;
  _Base_ptr local_128;
  undefined1 local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  string local_f8 [32];
  reference local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  ArrayIndex in_stack_ffffffffffffff94;
  Value *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffb8;
  FastWriter local_38;
  
  local_38.document_.field_2._8_8_ = in_RDX;
  poVar3 = std::operator<<((ostream *)streamMetaFile,in_RSI);
  poVar3 = std::operator<<(poVar3,": ");
  Json::FastWriter::FastWriter(in_stack_fffffffffffffda0);
  Json::FastWriter::write_abi_cxx11_
            (&local_38,(int)&stack0xffffffffffffff98,(void *)local_38.document_.field_2._8_8_,in_RCX
            );
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  Json::FastWriter::~FastWriter(in_stack_fffffffffffffda0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x13c717);
    cVar6 = Json::Value::begin((Value *)in_stack_fffffffffffffda0);
    local_b0 = (_Base_ptr)cVar6.super_ValueIteratorBase.current_._M_node;
    local_a8 = cVar6.super_ValueIteratorBase.isNull_;
    local_a0 = local_b0;
    local_98 = local_a8;
    while( true ) {
      cVar6 = Json::Value::end((Value *)in_stack_fffffffffffffda0);
      local_d0 = (_Base_ptr)cVar6.super_ValueIteratorBase.current_._M_node;
      local_c8 = cVar6.super_ValueIteratorBase.isNull_;
      local_c0 = local_d0;
      local_b8 = local_c8;
      bVar1 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)in_stack_fffffffffffffda0,
                         (SelfType *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      local_d8 = Json::ValueConstIterator::operator*((ValueConstIterator *)0x13c806);
      Json::Value::asString_abi_cxx11_(in_stack_ffffffffffffffb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_f8);
      Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffffda0);
    }
    hbm::streaming::StreamClient::subscribe(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    poVar3 = std::operator<<((ostream *)&std::cout,"The following ");
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_90);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3," signal(s) were subscribed: ");
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffda0,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffd98);
    while( true ) {
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd98);
      if (!bVar1) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"\'");
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_100);
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,"\' ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_100);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffdb0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"streamMetaInformationCb");
      std::operator<<(poVar3," the following signal(s) is(are) not available anymore: ");
      cVar6 = Json::Value::begin((Value *)in_stack_fffffffffffffda0);
      local_138 = (_Base_ptr)cVar6.super_ValueIteratorBase.current_._M_node;
      local_130 = cVar6.super_ValueIteratorBase.isNull_;
      local_128 = local_138;
      local_120 = local_130;
      while( true ) {
        cVar6 = Json::Value::end((Value *)in_stack_fffffffffffffda0);
        local_158 = (_Base_ptr)cVar6.super_ValueIteratorBase.current_._M_node;
        local_150 = cVar6.super_ValueIteratorBase.isNull_;
        local_148 = local_158;
        local_140 = local_150;
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)in_stack_fffffffffffffda0,
                           (SelfType *)in_stack_fffffffffffffd98);
        if (!bVar1) break;
        local_160 = Json::ValueConstIterator::operator*((ValueConstIterator *)0x13cc01);
        Json::Value::asString_abi_cxx11_(in_stack_ffffffffffffffb8);
        poVar3 = std::operator<<((ostream *)&std::cout,local_180);
        std::operator<<(poVar3,", ");
        std::__cxx11::string::~string(local_180);
        Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffffda0);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
      if (((!bVar1) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98),
          bVar1)) && (bVar1 = Json::Value::empty((Value *)in_stack_fffffffffffffd98), !bVar1)) {
        Json::Value::operator[](in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        UVar2 = Json::Value::asUInt(in_stack_00000438);
        if (0x19 < UVar2) {
          hbm::streaming::StreamClient::address_abi_cxx11_(in_stack_fffffffffffffd98);
          poVar3 = std::operator<<((ostream *)&std::cout,local_1a8);
          poVar3 = std::operator<<(poVar3,": ring buffer fill level is ");
          Json::Value::operator[](in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
          UVar2 = Json::Value::asUInt(in_stack_00000438);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar2);
          poVar3 = std::operator<<(poVar3,"%");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_1a8);
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	streamMetaFile << method << ": " << Json::FastWriter().write(params) << std::endl;
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			signalReferences.push_back(element.asString());
		}

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
			for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				std::cout << "'" << *iter << "' ";
			}
			std::cout << std::endl;
		} catch(const std::runtime_error& e) {
			std::cerr << __FUNCTION__ << " error '" << e.what() << "' subscribing the following signal(s): ";
		}
	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << __FUNCTION__ << " the following signal(s) is(are) not available anymore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl;
	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	}
}